

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void hash_free_active(hash *hash,hash_free_func *free_func)

{
  avl_node *node;
  avl_node *paVar1;
  ulong uVar2;
  
  if (hash->nbuckets != 0) {
    uVar2 = 0;
    do {
      node = avl_first(hash->buckets + uVar2);
      while (node != (avl_node *)0x0) {
        paVar1 = avl_next(node);
        avl_remove(hash->buckets + uVar2,node);
        (*free_func)((hash_elem *)node);
        node = paVar1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < hash->nbuckets);
  }
  free(hash->buckets);
  return;
}

Assistant:

void hash_free_active(struct hash *hash, hash_free_func *free_func)
{
    size_t i;

#ifdef _HASH_TREE
    struct avl_node *node;
#else
    struct list_elem *e, *e_next;
#endif

    struct hash_elem *h;

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        node = avl_first(hash->buckets + i);
        while(node){
            h = _get_entry(node, struct hash_elem, avl);
            node = avl_next(node);
            avl_remove(hash->buckets + i, &h->avl);
            free_func(h);
        }

#else
        e = list_begin(hash->buckets + i);
        while(e) {
            e_next = list_remove(hash->buckets + i, e);
            h = _get_entry(e, struct hash_elem, list_elem);
            free_func(h);
            e = e_next;
        }

#endif
    }

    hash_free(hash);
}